

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestMutualRecursionA_SubMessage * __thiscall
proto2_unittest::TestMutualRecursionA_SubGroup::_internal_mutable_sub_message
          (TestMutualRecursionA_SubGroup *this)

{
  TestMutualRecursionA_SubMessage *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.sub_message_;
  if (pTVar1 != (TestMutualRecursionA_SubMessage *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestMutualRecursionA_SubMessage *)
           google::protobuf::Arena::
           DefaultConstruct<proto2_unittest::TestMutualRecursionA_SubMessage>(arena);
  (this->field_0)._impl_.sub_message_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestMutualRecursionA_SubMessage* PROTOBUF_NONNULL TestMutualRecursionA_SubGroup::_internal_mutable_sub_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.sub_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMutualRecursionA_SubMessage>(GetArena());
    _impl_.sub_message_ = reinterpret_cast<::proto2_unittest::TestMutualRecursionA_SubMessage*>(p);
  }
  return _impl_.sub_message_;
}